

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O2

void __thiscall UDUNITS_commonAlias_Test::UDUNITS_commonAlias_Test(UDUNITS_commonAlias_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00193190;
  return;
}

Assistant:

TEST(UDUNITS, commonAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-common.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert{0};
    int mismatchUnit{0};
    int mismatchVal{0};
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (alias == nullptr) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(nameUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    if (definitionUnit.has_same_base(nameUnit)) {
                        std::cout << "singular name and unit"
                                  << " multiplier do not match " << sname
                                  << " and " << def << "\n";
                        ++mismatchVal;
                    } else {
                        std::cout << "singular name and unit do not have the "
                                  << "same base units " << sname << " and "
                                  << def << "\n";
                        ++mismatchUnit;
                    }
                }
            }
            if (name->FirstChildElement("plural")) {
                auto pname =
                    name->FirstChildElement("plural")->FirstChild()->Value();
                nameUnit = units::unit_from_string(pname);
                if (is_error(nameUnit)) {
                    std::cout << "unable to convert plural name " << pname
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (convert(
                            unit_cast(nameUnit), unit_cast(definitionUnit)) !=
                        1.0) {
                        if (definitionUnit.has_same_base(nameUnit)) {
                            std::cout << "plural name and unit multiplier "
                                      << "do not match " << sname << " and "
                                      << def << "\n";
                            ++mismatchVal;
                        } else {
                            std::cout << "plural name and unit "
                                      << "do not have the same base units "
                                      << sname << " and " << def << "\n";
                            ++mismatchUnit;
                        }
                    }
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert symbol" << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(symUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    if (definitionUnit.has_same_base(symUnit)) {
                        std::cout
                            << "symbol and unit multiplier do not mismatch"
                            << symString << " and " << def << "\n";
                        ++mismatchVal;
                    } else {
                        std::cout << "symbol and unit do not have"
                                  << " the same base units " << symString
                                  << " and " << def << "\n";
                        ++mismatchUnit;
                    }
                    std::cout << "symbol and unit do not match " << symString
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    if (failConvert > 0) {
        std::cout << failConvert << " units were unable to convert at all\n";
    }
    if (mismatchUnit > 0) {
        std::cout << mismatchUnit
                  << " units converted but had different base units\n";
    }
    if (mismatchVal > 0) {
        std::cout << mismatchVal << " units had different multipliers\n";
    }
    // EXPECT_EQ(failConvert, 0);
}